

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.h
# Opt level: O2

bool __thiscall crnlib::data_stream::write_line(data_stream *this,dynamic_string *str)

{
  uint uVar1;
  char *pcVar2;
  
  if (str->m_len != 0) {
    pcVar2 = "";
    if (str->m_pStr != (char *)0x0) {
      pcVar2 = str->m_pStr;
    }
    uVar1 = (*this->_vptr_data_stream[6])(this,pcVar2);
    return uVar1 == str->m_len;
  }
  return true;
}

Assistant:

inline bool is_empty() const { return !m_len; }